

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O0

void TestSuite::usage(int argc,char **argv)

{
  undefined8 *in_RSI;
  
  printf("\n");
  printf("Usage: %s [-f <keyword>] [-r <parameter>] [-p]\n",*in_RSI);
  printf("\n");
  printf("    -f, --filter\n");
  printf("        Run specific tests matching the given keyword.\n");
  printf("    -r, --range\n");
  printf("        Run TestRange-based tests using given parameter value.\n");
  printf("    -p, --preserve\n");
  printf("        Do not clean up test files.\n");
  printf("    --abort-on-failure\n");
  printf("        Immediately abort the test if failure happens.\n");
  printf("    --suppress-msg\n");
  printf("        Suppress test messages.\n");
  printf("    --display-msg\n");
  printf("        Display test messages.\n");
  printf("\n");
  return;
}

Assistant:

static void usage(int argc, char** argv) {
        printf("\n");
        printf("Usage: %s [-f <keyword>] [-r <parameter>] [-p]\n", argv[0]);
        printf("\n");
        printf("    -f, --filter\n");
        printf("        Run specific tests matching the given keyword.\n");
        printf("    -r, --range\n");
        printf("        Run TestRange-based tests using given parameter value.\n");
        printf("    -p, --preserve\n");
        printf("        Do not clean up test files.\n");
        printf("    --abort-on-failure\n");
        printf("        Immediately abort the test if failure happens.\n");
        printf("    --suppress-msg\n");
        printf("        Suppress test messages.\n");
        printf("    --display-msg\n");
        printf("        Display test messages.\n");
        printf("\n");
    }